

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  int i;
  uint uVar2;
  long lVar3;
  RTPPacket *p;
  ostream *poVar4;
  int errcode;
  int errcode_00;
  int errcode_01;
  string *this;
  RTPTime RVar5;
  RTPTime RVar6;
  RTPTime delay;
  string sStack_109c8;
  uint8_t silencebuffer [160];
  RTPAddress RStack_10908;
  undefined4 uStack_108f8;
  RTPUDPv4TransmissionParams RStack_108f0;
  RTPSessionParams sessionparams;
  RTPSession session;
  
  jrtplib::RTPSession::RTPSession(&session,(RTPRandom *)0x0,(RTPMemoryManager *)0x0);
  jrtplib::RTPSessionParams::RTPSessionParams(&sessionparams);
  RStack_108f0.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&RStack_108f0.localIPs;
  RStack_108f0.super_RTPTransmissionParams.protocol = IPv4UDPProto;
  RStack_108f0.super_RTPTransmissionParams._vptr_RTPTransmissionParams =
       (_func_int **)&PTR__RTPUDPv4TransmissionParams_00143060;
  RStack_108f0.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  _M_node._M_size = 0;
  RStack_108f0.bindIP = 0;
  RStack_108f0.mcastifaceIP = 0;
  RStack_108f0.multicastTTL = '\x01';
  RStack_108f0.rtpsendbuf = 0x8000;
  RStack_108f0.rtprecvbuf = 0x8000;
  RStack_108f0.rtcpsendbuf = 0x8000;
  RStack_108f0.rtcprecvbuf = 0x8000;
  RStack_108f0.m_pAbortDesc = (RTPAbortDescriptors *)0x0;
  sessionparams.owntsunit = 0.000125;
  RStack_108f0._68_5_ = 0;
  RStack_108f0.rtpsock._1_3_ = 0;
  RStack_108f0.rtcpsock = 0;
  RStack_108f0.useexistingsockets = false;
  RStack_108f0.super_RTPTransmissionParams._12_2_ = 8000;
  RStack_108f0.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       RStack_108f0.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  uVar2 = jrtplib::RTPSession::Create
                    (&session,&sessionparams,&RStack_108f0.super_RTPTransmissionParams,IPv4UDPProto)
  ;
  if ((int)uVar2 < 0) {
    jrtplib::RTPGetErrorString_abi_cxx11_((string *)silencebuffer,(jrtplib *)(ulong)uVar2,errcode);
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)silencebuffer);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    RStack_10908.addresstype = IPv4Address;
    RStack_10908._12_4_ = 0x7f000001;
    RStack_10908._vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_00143d10;
    uStack_108f8 = 0x23292328;
    uVar2 = jrtplib::RTPSession::AddDestination(&session,&RStack_10908);
    if (-1 < (int)uVar2) {
      jrtplib::RTPSession::SetDefaultPayloadType(&session,'`');
      jrtplib::RTPSession::SetDefaultMark(&session,false);
      jrtplib::RTPSession::SetDefaultTimestampIncrement(&session,0xa0);
      for (lVar3 = 0; lVar3 != 0xa0; lVar3 = lVar3 + 1) {
        silencebuffer[lVar3] = 0x80;
      }
      delay.m_t = 0.02;
      RVar5 = jrtplib::RTPTime::CurrentTime();
      while( true ) {
        uVar2 = jrtplib::RTPSession::SendPacket(&session,silencebuffer,0xa0);
        if ((int)uVar2 < 0) break;
        jrtplib::RTPSession::BeginDataAccess(&session);
        bVar1 = jrtplib::RTPSession::GotoFirstSource(&session);
        while (bVar1 != false) {
          while( true ) {
            p = jrtplib::RTPSession::GetNextPacket(&session);
            if (p == (RTPPacket *)0x0) break;
            poVar4 = std::operator<<((ostream *)&std::cout,"Got packet with ");
            poVar4 = std::operator<<(poVar4,"extended sequence number ");
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            poVar4 = std::operator<<(poVar4," from SSRC ");
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::endl<char,std::char_traits<char>>(poVar4);
            jrtplib::RTPSession::DeletePacket(&session,p);
          }
          bVar1 = jrtplib::RTPSession::GotoNextSource(&session);
        }
        jrtplib::RTPSession::EndDataAccess(&session);
        jrtplib::RTPTime::Wait(&delay);
        RVar6 = jrtplib::RTPTime::CurrentTime();
        if (60.0 < RVar6.m_t - RVar5.m_t) {
          delay.m_t = 10.0;
          jrtplib::RTPSession::BYEDestroy(&session,&delay,"Time\'s up",9);
          jrtplib::RTPUDPv4TransmissionParams::~RTPUDPv4TransmissionParams(&RStack_108f0);
          std::__cxx11::string::~string((string *)&sessionparams.cname);
          jrtplib::RTPSession::~RTPSession(&session);
          return 0;
        }
      }
      jrtplib::RTPGetErrorString_abi_cxx11_(&sStack_109c8,(jrtplib *)(ulong)uVar2,errcode_01);
      poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&sStack_109c8);
      std::endl<char,std::char_traits<char>>(poVar4);
      this = &sStack_109c8;
      goto LAB_0012199b;
    }
    jrtplib::RTPGetErrorString_abi_cxx11_
              ((string *)silencebuffer,(jrtplib *)(ulong)uVar2,errcode_00);
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)silencebuffer);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  this = (string *)silencebuffer;
LAB_0012199b:
  std::__cxx11::string::~string((string *)this);
  exit(-1);
}

Assistant:

int main(void)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSADATA dat;
	WSAStartup(MAKEWORD(2,2),&dat);
#endif // RTP_SOCKETTYPE_WINSOCK
		
	RTPSession session;
	
	RTPSessionParams sessionparams;
	sessionparams.SetOwnTimestampUnit(1.0/8000.0);
			
	RTPUDPv4TransmissionParams transparams;
	transparams.SetPortbase(8000);
			
	int status = session.Create(sessionparams,&transparams);
	if (status < 0)
	{
		std::cerr << RTPGetErrorString(status) << std::endl;
		exit(-1);
	}
	
	uint8_t localip[]={127,0,0,1};
	RTPIPv4Address addr(localip,9000);
	
	status = session.AddDestination(addr);
	if (status < 0)
	{
		std::cerr << RTPGetErrorString(status) << std::endl;
		exit(-1);
	}
	
	session.SetDefaultPayloadType(96);
	session.SetDefaultMark(false);
	session.SetDefaultTimestampIncrement(160);
	
	uint8_t silencebuffer[160];
	for (int i = 0 ; i < 160 ; i++)
		silencebuffer[i] = 128;

	RTPTime delay(0.020);
	RTPTime starttime = RTPTime::CurrentTime();
	
	bool done = false;
	while (!done)
	{
		status = session.SendPacket(silencebuffer,160);
		if (status < 0)
		{
			std::cerr << RTPGetErrorString(status) << std::endl;
			exit(-1);
		}
		
		session.BeginDataAccess();
		if (session.GotoFirstSource())
		{
			do
			{
				RTPPacket *packet;

				while ((packet = session.GetNextPacket()) != 0)
				{
					std::cout << "Got packet with " 
					          << "extended sequence number " 
					          << packet->GetExtendedSequenceNumber() 
					          << " from SSRC " << packet->GetSSRC() 
					          << std::endl;
					session.DeletePacket(packet);
				}
			} while (session.GotoNextSource());
		}
		session.EndDataAccess();
			
		RTPTime::Wait(delay);
		
		RTPTime t = RTPTime::CurrentTime();
		t -= starttime;
		if (t > RTPTime(60.0))
			done = true;
	}
	
	delay = RTPTime(10.0);
	session.BYEDestroy(delay,"Time's up",9);
	
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSACleanup();
#endif // RTP_SOCKETTYPE_WINSOCK
	return 0;
}